

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bddisasm_crt.c
# Opt level: O2

char * nd_strcat_s(char *dst,ND_SIZET dst_size,char *src)

{
  char cVar1;
  char *pcVar2;
  ND_SIZET NVar3;
  ND_SIZET NVar4;
  bool bVar5;
  
  pcVar2 = dst;
  NVar3 = dst_size;
  while (NVar3 != 0) {
    if (*pcVar2 == '\0') {
      NVar4 = 1;
      goto LAB_0015f74c;
    }
    pcVar2 = pcVar2 + 1;
    NVar3 = NVar3 - 1;
  }
  goto LAB_0015f76c;
  while (bVar5 = NVar3 != NVar4, NVar4 = NVar4 + 1, bVar5) {
LAB_0015f74c:
    cVar1 = src[NVar4 - 1];
    pcVar2[NVar4 - 1] = cVar1;
    if (cVar1 == '\0') break;
  }
  if (cVar1 == '\0') {
    return dst;
  }
LAB_0015f76c:
  nd_memset(dst,0,dst_size);
  return (char *)0x0;
}

Assistant:

char *
nd_strcat_s(
    char *dst,
    ND_SIZET dst_size,
    const char *src
    )
{
    char *p;
    ND_SIZET available;

    p = dst;
    available = dst_size;
    while (available > 0 && *p != 0)
    {
        p++;
        available--;
    }

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    while ((*p++ = *src++) != 0 && --available > 0);

    if (available == 0)
    {
        nd_memzero(dst, dst_size);
        return (char *)ND_NULL;
    }

    return dst;
}